

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O1

void __thiscall FThinkerList::AddTail(FThinkerList *this,DThinker *thinker)

{
  uint uVar1;
  DThinker *pointed;
  DThinker *pDVar2;
  
  if ((thinker->PrevThinker != (DThinker *)0x0) || (thinker->NextThinker != (DThinker *)0x0)) {
    __assert_fail("thinker->PrevThinker == NULL && thinker->NextThinker == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                  ,0x43,"void FThinkerList::AddTail(DThinker *)");
  }
  if (((thinker->super_DObject).ObjectFlags & 0x20) != 0) {
    __assert_fail("!(thinker->ObjectFlags & OF_EuthanizeMe)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                  ,0x44,"void FThinkerList::AddTail(DThinker *)");
  }
  if (this->Sentinel == (DThinker *)0x0) {
    pDVar2 = (DThinker *)
             M_Malloc_Dbg(0x38,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                          ,0x1f9);
    DObject::DObject((DObject *)pDVar2);
    (pDVar2->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f8ca8;
    this->Sentinel = pDVar2;
    uVar1 = (pDVar2->super_DObject).ObjectFlags;
    (pDVar2->super_DObject).ObjectFlags = uVar1 | 0x400;
    pDVar2->NextThinker = pDVar2;
    pDVar2->PrevThinker = pDVar2;
    if ((uVar1 & 3) != 0 && GC::State == 1) {
      GC::Barrier((DObject *)0x0,(DObject *)pDVar2);
    }
  }
  pDVar2 = this->Sentinel;
  pointed = pDVar2->PrevThinker;
  if (pointed->NextThinker == pDVar2) {
    thinker->PrevThinker = pointed;
    thinker->NextThinker = pDVar2;
    pointed->NextThinker = thinker;
    pDVar2->PrevThinker = thinker;
    if (((pointed != (DThinker *)0x0) && (((pointed->super_DObject).ObjectFlags & 3) != 0)) &&
       (((thinker->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&thinker->super_DObject,&pointed->super_DObject);
    }
    pDVar2 = this->Sentinel;
    if (((pDVar2 != (DThinker *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 3) != 0)) &&
       (((thinker->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&thinker->super_DObject,&pDVar2->super_DObject);
    }
    if (((thinker != (DThinker *)0x0) && (((thinker->super_DObject).ObjectFlags & 3) != 0)) &&
       (((pointed->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&pointed->super_DObject,&thinker->super_DObject);
    }
    if (((thinker != (DThinker *)0x0) && (((thinker->super_DObject).ObjectFlags & 3) != 0)) &&
       (((this->Sentinel->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&this->Sentinel->super_DObject,&thinker->super_DObject);
      return;
    }
    return;
  }
  __assert_fail("tail->NextThinker == Sentinel",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                ,0x4e,"void FThinkerList::AddTail(DThinker *)");
}

Assistant:

void FThinkerList::AddTail(DThinker *thinker)
{
	assert(thinker->PrevThinker == NULL && thinker->NextThinker == NULL);
	assert(!(thinker->ObjectFlags & OF_EuthanizeMe));
	if (Sentinel == NULL)
	{
		Sentinel = new DThinker(DThinker::NO_LINK);
		Sentinel->ObjectFlags |= OF_Sentinel;
		Sentinel->NextThinker = Sentinel;
		Sentinel->PrevThinker = Sentinel;
		GC::WriteBarrier(Sentinel);
	}
	DThinker *tail = Sentinel->PrevThinker;
	assert(tail->NextThinker == Sentinel);
	thinker->PrevThinker = tail;
	thinker->NextThinker = Sentinel;
	tail->NextThinker = thinker;
	Sentinel->PrevThinker = thinker;
	GC::WriteBarrier(thinker, tail);
	GC::WriteBarrier(thinker, Sentinel);
	GC::WriteBarrier(tail, thinker);
	GC::WriteBarrier(Sentinel, thinker);
}